

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * Iterator(string *__return_storage_ptr__,string *FileName)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_249;
  undefined1 local_248 [12];
  undefined1 local_238 [12];
  undefined1 local_221;
  istream_type local_220 [8];
  ifstream ResultReader;
  string *FileName_local;
  string *Results;
  
  std::ifstream::ifstream(local_220,(string *)FileName,_S_in);
  local_221 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_238,local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_248);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_238._0_8_;
  __beg._M_c = local_238._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_248._0_8_;
  __end._M_c = local_248._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_221 = 1;
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string Iterator(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::string Results((std::istreambuf_iterator<char>(ResultReader)),
                         std::istreambuf_iterator<char>());
    return Results;
}